

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O1

void __thiscall slang::JsonWriter::endObject(JsonWriter *this)

{
  _Head_base<0UL,_slang::FormatBuffer_*,_false> _Var1;
  ulong uVar2;
  uint uVar3;
  size_t sVar4;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  char *local_38 [2];
  ulong local_28;
  
  _Var1._M_head_impl =
       (this->buffer)._M_t.
       super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>._M_t.
       super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>.
       super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl;
  sVar4 = findLastComma(this);
  if (*(size_t *)((long)&(_Var1._M_head_impl)->buf + 0x18) < sVar4) {
    (*(code *)**(undefined8 **)&(_Var1._M_head_impl)->buf)(_Var1._M_head_impl,sVar4);
  }
  uVar2 = *(size_t *)((long)&(_Var1._M_head_impl)->buf + 0x18);
  if (uVar2 < sVar4) {
    sVar4 = uVar2;
  }
  *(size_t *)((long)&(_Var1._M_head_impl)->buf + 0x10) = sVar4;
  if (this->pretty == true) {
    uVar3 = this->currentIndent - this->indentSize;
    local_28 = (ulong)uVar3;
    this->currentIndent = uVar3;
    local_38[0] = "";
    fmt.size_ = 8;
    fmt.data_ = "\n{:{}}}}";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_38;
    args.desc_ = 0x1c;
    ::fmt::v9::detail::vformat_to<char>
              ((buffer<char> *)
               (this->buffer)._M_t.
               super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
               .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,fmt,args,
               (locale_ref)0x0);
    endValue(this);
    return;
  }
  ::fmt::v9::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (this->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,"},","");
  return;
}

Assistant:

void JsonWriter::endObject() {
    buffer->resize(findLastComma());
    if (pretty) {
        currentIndent -= indentSize;
        buffer->format("\n{:{}}}}", "", currentIndent);
        endValue();
    }
    else {
        buffer->append("},");
    }
}